

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int declaration_specifiers(sym_t *s)

{
  int iVar1;
  
  iVar1 = t->id;
  if (iVar1 == 0x85) {
    last_id = iVar1;
    t = get_token();
    eline = t->line;
    ecolumn = t->column;
    if (s->type_id == 0) {
      s->type_id = 0x85;
      goto LAB_00105b75;
    }
  }
  else if (iVar1 == 0x84) {
    last_id = iVar1;
    t = get_token();
    eline = t->line;
    ecolumn = t->column;
    if (s->type_id == 0) {
      s->type_id = 0x84;
      goto LAB_00105b75;
    }
  }
  else {
    if (iVar1 != 0x80) {
      return 0;
    }
    last_id = iVar1;
    t = get_token();
    eline = t->line;
    ecolumn = t->column;
    if (s->type_id == 0) {
      s->type_id = 0x80;
      goto LAB_00105b75;
    }
  }
  err(E,"two or more data types in declaration specifiers");
LAB_00105b75:
  do {
    iVar1 = declaration_specifiers(s);
  } while (iVar1 != 0);
  return 1;
}

Assistant:

int declaration_specifiers(sym_t* s)
{
    if (type_specifier(s))
    {
        while (declaration_specifiers(s))
            ;
        return 1;
    }

    return 0;
}